

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O1

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> * __thiscall
kainjow::mustache::html_escape<std::__cxx11::wstring>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,mustache *this,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *s)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  std::__cxx11::wstring::reserve((ulong)__return_storage_ptr__);
  lVar2 = *(long *)(this + 8);
  if (lVar2 != 0) {
    lVar3 = *(long *)this;
    lVar4 = 0;
    do {
      iVar1 = *(int *)(lVar3 + lVar4);
      if (iVar1 < 0x27) {
        if (iVar1 == 0x22) {
          local_58 = 0x7100000026;
          uStack_50 = 0x6f00000075;
          local_48 = 0x3b00000074;
          std::__cxx11::wstring::append((wchar_t *)__return_storage_ptr__,(ulong)&local_58);
        }
        else if (iVar1 == 0x26) {
          local_58 = 0x6100000026;
          uStack_50 = 0x700000006d;
          local_48 = CONCAT44(local_48._4_4_,0x3b);
          std::__cxx11::wstring::append((wchar_t *)__return_storage_ptr__,(ulong)&local_58);
        }
        else {
LAB_001e1fe8:
          std::__cxx11::wstring::_M_replace_aux
                    ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
                     L'\x01');
        }
      }
      else if (iVar1 == 0x27) {
        local_58 = 0x6100000026;
        uStack_50 = 0x6f00000070;
        local_48 = 0x3b00000073;
        std::__cxx11::wstring::append((wchar_t *)__return_storage_ptr__,(ulong)&local_58);
      }
      else if (iVar1 == 0x3c) {
        local_58 = 0x6c00000026;
        uStack_50 = 0x3b00000074;
        std::__cxx11::wstring::append((wchar_t *)__return_storage_ptr__,(ulong)&local_58);
      }
      else {
        if (iVar1 != 0x3e) goto LAB_001e1fe8;
        local_58 = 0x6700000026;
        uStack_50 = 0x3b00000074;
        std::__cxx11::wstring::append((wchar_t *)__return_storage_ptr__,(ulong)&local_58);
      }
      lVar4 = lVar4 + 4;
    } while (lVar2 << 2 != lVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

string_type html_escape(const string_type& s) {
    string_type ret;
    ret.reserve(s.size()*2);
    for (const auto ch : s) {
        switch (ch) {
            case '&':
                ret.append({'&','a','m','p',';'});
                break;
            case '<':
                ret.append({'&','l','t',';'});
                break;
            case '>':
                ret.append({'&','g','t',';'});
                break;
            case '\"':
                ret.append({'&','q','u','o','t',';'});
                break;
            case '\'':
                ret.append({'&','a','p','o','s',';'});
                break;
            default:
                ret.append(1, ch);
                break;
        }
    }
    return ret;
}